

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void def_symbol(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
               node_t_conflict def_node,node_code_t linkage)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  type *type1;
  type *type2;
  symbol_t el_00;
  symbol_t el_01;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  node_t_conflict *ppnVar9;
  VARR_node_t *pVVar10;
  ulong uVar11;
  char *pcVar12;
  undefined4 in_register_00000034;
  node_t_conflict pnVar13;
  byte bVar14;
  size_t sVar15;
  pos_t pVar16;
  symbol_t el;
  ulong local_c8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  VARR_node_t *local_a0;
  symbol_t local_60;
  
  pnVar13 = (node_t_conflict)CONCAT44(in_register_00000034,mode);
  if (pnVar13->code == N_IGNORE) {
    return;
  }
  if ((id == (node_t_conflict)0x0) || (pnVar13->code != N_ID)) {
LAB_0018b149:
    __assert_fail("id->code == N_ID && scope != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1975,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  iVar7 = (int)def_node;
  uVar5 = id->code - N_FOR;
  if ((0x36 < uVar5) || ((0x40100300000081U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
    __assert_fail("scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1977,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  pvVar4 = scope->attr;
  bVar1 = *(byte *)((long)pvVar4 + 0x28);
  iVar3 = *(int *)((long)pvVar4 + 0x38);
  type1 = *(type **)((long)pvVar4 + 0x40);
  bVar14 = bVar1 >> 5 & 1;
  if ((bVar1 & 6) == 0 && bVar14 != 0) {
    pVar16 = get_node_pos(c2m_ctx,pnVar13);
    error(c2m_ctx,0x1c1e75,pVar16.fname,pVar16._8_8_,(pnVar13->u).s.s);
  }
  local_c8 = local_c8 & 0xffffffff00000000;
  el_00.id = pnVar13;
  el_00._0_8_ = local_c8;
  el_00.scope = id;
  el_00.def_node = (node_t_conflict)uStack_b0;
  el_00.aux_node = (node_t_conflict)local_a8;
  el_00.defs = local_a0;
  iVar6 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_60);
  if (iVar6 == 0) {
    symbol_insert(c2m_ctx,S_REGULAR,pnVar13,id,scope,(node_t_conflict)0x0);
    return;
  }
  bVar2 = *(byte *)((long)(local_60.def_node)->attr + 0x28);
  type2 = *(type **)((long)(local_60.def_node)->attr + 0x40);
  if (((scope->code == N_ENUM_CONST) || ((local_60.def_node)->code == N_ENUM_CONST)) &&
     (scope->code != (local_60.def_node)->code)) {
    pVar16 = get_node_pos(c2m_ctx,pnVar13);
    error(c2m_ctx,0x1c1e99,pVar16.fname,pVar16._8_8_,(pnVar13->u).s.s);
    return;
  }
  if (iVar7 == 0) {
    if (((bVar1 & 1) == 0) || ((bVar2 & 1) == 0)) {
      pcVar12 = "repeated declaration %s";
    }
    else {
      iVar6 = type_eq_p(type1,type2);
      pcVar12 = "repeated declaration %s";
      if (iVar6 != 0) goto LAB_0018af31;
    }
LAB_0018af12:
    pVar16 = get_node_pos(c2m_ctx,pnVar13);
    error(c2m_ctx,pcVar12,pVar16.fname,pVar16._8_8_,(pnVar13->u).s.s);
  }
  else {
    iVar6 = compatible_types_p(type1,type2,0);
    if (iVar6 == 0) {
      pcVar12 = "incompatible types of %s declarations";
      goto LAB_0018af12;
    }
  }
LAB_0018af31:
  if ((bVar2 >> 5 & 1) != bVar14) {
    pVar16 = get_node_pos(c2m_ctx,pnVar13);
    error(c2m_ctx,0x1c1f03,pVar16.fname,pVar16._8_8_,(pnVar13->u).s.s);
  }
  if ((iVar7 == 0x59 && iVar3 == 0x58) || (iVar7 == 0x58 && iVar3 == 0x59)) {
    pVar16 = get_node_pos(c2m_ctx,pnVar13);
    warning(c2m_ctx,0x1c1f38,pVar16.fname,pVar16._8_8_,(pnVar13->u).s.s);
  }
  ppnVar9 = (local_60.defs)->varr;
  if (ppnVar9 == (node_t_conflict *)0x0) {
    def_symbol_cold_4();
LAB_0018b16d:
    mir_varr_error((char *)ppnVar9);
  }
  uVar8 = (local_60.defs)->els_num + 1;
  if ((local_60.defs)->size < uVar8) {
    sVar15 = (uVar8 >> 1) + uVar8;
    ppnVar9 = (node_t_conflict *)realloc(ppnVar9,sVar15 * 8);
    (local_60.defs)->varr = ppnVar9;
    (local_60.defs)->size = sVar15;
  }
  sVar15 = (local_60.defs)->els_num;
  (local_60.defs)->els_num = sVar15 + 1;
  (local_60.defs)->varr[sVar15] = scope;
  iVar7 = incomplete_type_p(c2m_ctx,type2);
  if (iVar7 != 0) {
    ppnVar9 = (node_t_conflict *)&DAT_00000018;
    pVVar10 = (VARR_node_t *)malloc(0x18);
    if (pVVar10 == (VARR_node_t *)0x0) goto LAB_0018b16d;
    pVVar10->els_num = 0;
    pVVar10->size = 4;
    ppnVar9 = (node_t_conflict *)malloc(0x20);
    pVVar10->varr = ppnVar9;
    uVar8 = 0;
    do {
      if ((local_60.defs)->els_num <= uVar8) goto LAB_0018b0f0;
      if ((local_60.defs)->varr == (node_t_conflict *)0x0) {
        def_symbol_cold_3();
LAB_0018b144:
        def_symbol_cold_2();
        goto LAB_0018b149;
      }
      if (pVVar10->varr == (node_t_conflict *)0x0) goto LAB_0018b144;
      pnVar13 = (local_60.defs)->varr[uVar8];
      uVar11 = pVVar10->els_num + 1;
      if (pVVar10->size < uVar11) {
        sVar15 = (uVar11 >> 1) + uVar11;
        ppnVar9 = (node_t_conflict *)realloc(pVVar10->varr,sVar15 * 8);
        pVVar10->varr = ppnVar9;
        pVVar10->size = sVar15;
      }
      sVar15 = pVVar10->els_num;
      pVVar10->els_num = sVar15 + 1;
      pVVar10->varr[sVar15] = pnVar13;
      uVar8 = uVar8 + 1;
    } while (local_60.defs != (VARR_node_t *)0x0);
    def_symbol_cold_1();
LAB_0018b0f0:
    el_01.id = local_60.id;
    el_01.mode = local_60.mode;
    el_01._4_4_ = local_60._4_4_;
    el_01.scope = local_60.scope;
    el_01.def_node = scope;
    el_01.aux_node = local_60.aux_node;
    el_01.defs = pVVar10;
    HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_01,HTAB_REPLACE,&local_60);
  }
  return;
}

Assistant:

static void def_symbol (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t def_node, node_code_t linkage) {
  symbol_t sym;
  struct decl_spec tab_decl_spec, decl_spec;

  if (id->code == N_IGNORE) return;
  assert (id->code == N_ID && scope != NULL);
  assert (scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT
          || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR);
  decl_spec = ((decl_t) def_node->attr)->decl_spec;
  if (decl_spec.thread_local_p && !decl_spec.static_p && !decl_spec.extern_p)
    error (c2m_ctx, POS (id), "auto %s is declared as thread local", id->u.s.s);
  if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
    symbol_insert (c2m_ctx, mode, id, scope, def_node, NULL);
    return;
  }
  tab_decl_spec = ((decl_t) sym.def_node->attr)->decl_spec;
  if ((def_node->code == N_ENUM_CONST || sym.def_node->code == N_ENUM_CONST)
      && def_node->code != sym.def_node->code) {
    error (c2m_ctx, POS (id), "%s redeclared as a different kind of symbol", id->u.s.s);
    return;
  } else if (linkage == N_IGNORE) {
    if (!decl_spec.typedef_p || !tab_decl_spec.typedef_p
        || !type_eq_p (decl_spec.type, tab_decl_spec.type))
#if defined(__APPLE__)
      /* a hack to use our definition instead of macosx for non-GNU compiler */
      if (strcmp (id->u.s.s, "__darwin_va_list") != 0)
#endif
        error (c2m_ctx, POS (id), "repeated declaration %s", id->u.s.s);
  } else if (!compatible_types_p (decl_spec.type, tab_decl_spec.type, FALSE)) {
    error (c2m_ctx, POS (id), "incompatible types of %s declarations", id->u.s.s);
  }
  if (tab_decl_spec.thread_local_p != decl_spec.thread_local_p) {
    error (c2m_ctx, POS (id), "thread local and non-thread local declarations of %s", id->u.s.s);
  }
  if ((decl_spec.linkage == N_EXTERN && linkage == N_STATIC)
      || (decl_spec.linkage == N_STATIC && linkage == N_EXTERN))
    warning (c2m_ctx, POS (id), "%s defined with external and internal linkage", id->u.s.s);
  VARR_PUSH (node_t, sym.defs, def_node);
  if (incomplete_type_p (c2m_ctx, tab_decl_spec.type)) symbol_def_replace (c2m_ctx, sym, def_node);
}